

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::clear
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,Node **x)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = *x;
  pNVar1 = this->nil;
  if (pNVar2 != pNVar1) {
    if (pNVar2->parent == pNVar1) {
      this->nodebegin = pNVar1;
      pNVar2 = *x;
    }
    clear(this,&pNVar2->left);
    clear(this,&(*x)->right);
    pNVar2 = *x;
    if (pNVar2 != (Node *)0x0) {
      Node::~Node(pNVar2);
    }
    operator_delete(pNVar2,0x28);
    *x = this->nil;
    this->tot = this->tot - 1;
  }
  return;
}

Assistant:

void clear(Node *&x)
	{
		if (x == nil) return;
		if (x -> parent == nil) nodebegin = nil;
		clear(x -> left) , clear(x -> right) , delete x , x = nil , -- tot;
	}